

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O2

int run_test_threadpool_cancel_work(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  long lVar3;
  char *pcVar4;
  cancel_info ci;
  uv_work_t reqs [16];
  
  ci.reqs = reqs;
  ci.nreqs = 0x10;
  ci.stride = 0x80;
  uVar2 = uv_default_loop();
  saturate_threadpool();
  lVar3 = 0;
  do {
    if (lVar3 + 0x80 == 0x880) {
      iVar1 = uv_timer_init(uVar2,&ci.timer_handle);
      if (iVar1 == 0) {
        iVar1 = uv_timer_start(&ci.timer_handle,timer_cb,10,0);
        if (iVar1 == 0) {
          iVar1 = uv_run(uVar2,0);
          if (iVar1 == 0) {
            if (timer_cb_called == 1) {
              if (done2_cb_called == 0x10) {
                loop = (uv_loop_t *)uv_default_loop();
                close_loop(loop);
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                uVar2 = 0x113;
              }
              else {
                pcVar4 = "ARRAY_SIZE(reqs) == done2_cb_called";
                uVar2 = 0x111;
              }
            }
            else {
              pcVar4 = "1 == timer_cb_called";
              uVar2 = 0x110;
            }
          }
          else {
            pcVar4 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
            uVar2 = 0x10f;
          }
        }
        else {
          pcVar4 = "0 == uv_timer_start(&ci.timer_handle, timer_cb, 10, 0)";
          uVar2 = 0x10e;
        }
      }
      else {
        pcVar4 = "0 == uv_timer_init(loop, &ci.timer_handle)";
        uVar2 = 0x10d;
      }
      goto LAB_0015dd7d;
    }
    iVar1 = uv_queue_work(uVar2,(long)reqs[0].reserved + lVar3 + -0x10,work2_cb,done2_cb);
    lVar3 = lVar3 + 0x80;
  } while (iVar1 == 0);
  pcVar4 = "0 == uv_queue_work(loop, reqs + i, work2_cb, done2_cb)";
  uVar2 = 0x10b;
LAB_0015dd7d:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
          ,uVar2,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(threadpool_cancel_work) {
  struct cancel_info ci;
  uv_work_t reqs[16];
  uv_loop_t* loop;
  unsigned i;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  for (i = 0; i < ARRAY_SIZE(reqs); i++)
    ASSERT(0 == uv_queue_work(loop, reqs + i, work2_cb, done2_cb));

  ASSERT(0 == uv_timer_init(loop, &ci.timer_handle));
  ASSERT(0 == uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);
  ASSERT(ARRAY_SIZE(reqs) == done2_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}